

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_DeriveGateDelays
               (Mio_Gate_t *pGate,float **ptPinDelays,int nPins,int nInputs,float tDelayZero,
               float *ptDelaysRes,float *ptPinDelayMax)

{
  char *pcVar1;
  float fVar2;
  int local_50;
  int local_4c;
  int k;
  int i;
  float DelayMax;
  float Delay;
  Mio_Pin_t *pPin;
  float *ptPinDelayMax_local;
  float *ptDelaysRes_local;
  float tDelayZero_local;
  int nInputs_local;
  int nPins_local;
  float **ptPinDelays_local;
  Mio_Gate_t *pGate_local;
  
  if (pGate->nInputs != nPins) {
    __assert_fail("pGate->nInputs == nPins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x425,
                  "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                 );
  }
  for (local_4c = 0; local_4c < nInputs; local_4c = local_4c + 1) {
    ptDelaysRes[local_4c] = tDelayZero;
  }
  k = 0;
  local_4c = 0;
  while( true ) {
    if (nInputs <= local_4c) {
      *ptPinDelayMax = (float)k;
      return;
    }
    local_50 = 0;
    for (_DelayMax = pGate->pPins; _DelayMax != (Mio_Pin_t *)0x0; _DelayMax = _DelayMax->pNext) {
      if ((0.0 < ptPinDelays[local_50][local_4c] || ptPinDelays[local_50][local_4c] == 0.0) &&
         (fVar2 = ptPinDelays[local_50][local_4c] + (float)_DelayMax->dDelayBlockMax,
         ptDelaysRes[local_4c] < fVar2)) {
        ptDelaysRes[local_4c] = fVar2;
      }
      local_50 = local_50 + 1;
    }
    if (local_50 != nPins) break;
    if ((float)k < ptDelaysRes[local_4c]) {
      k = (int)ptDelaysRes[local_4c];
    }
    local_4c = local_4c + 1;
  }
  pcVar1 = Mio_GateReadName(pGate);
  printf("DEBUG: problem gate is %s\n",pcVar1);
  __assert_fail("k == nPins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                ,0x439,
                "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
               );
}

Assistant:

void Mio_DeriveGateDelays( Mio_Gate_t * pGate, 
    float ** ptPinDelays, int nPins, int nInputs, float tDelayZero, 
    float * ptDelaysRes, float * ptPinDelayMax )
{
    Mio_Pin_t * pPin;
    float Delay, DelayMax;
    int i, k;
    assert( pGate->nInputs == nPins );
    // set all the delays to the unused delay
    for ( i = 0; i < nInputs; i++ )
        ptDelaysRes[i] = tDelayZero;
    // compute the delays for each input and the max delay at the same time
    DelayMax = 0;
    for ( i = 0; i < nInputs; i++ )
    {
        for ( k = 0, pPin = pGate->pPins; pPin; pPin = pPin->pNext, k++ )
        {
            if ( ptPinDelays[k][i] < 0 )
                continue;
            Delay = ptPinDelays[k][i] + (float)pPin->dDelayBlockMax;
            if ( ptDelaysRes[i] < Delay )
                ptDelaysRes[i] = Delay;
        }
        if ( k != nPins )
        {
            printf ("DEBUG: problem gate is %s\n", Mio_GateReadName( pGate ));
        }
        assert( k == nPins );
        if ( DelayMax < ptDelaysRes[i] )
            DelayMax = ptDelaysRes[i];
    }
    *ptPinDelayMax = DelayMax;
}